

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.hpp
# Opt level: O1

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
::CompleteBestLiteralSelector
          (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
           *this,Ordering *ordering,Options *options)

{
  (this->super_LiteralSelector)._ord = ordering;
  (this->super_LiteralSelector)._opt = options;
  (this->super_LiteralSelector)._reversePolarity = false;
  (this->super_LiteralSelector)._vptr_LiteralSelector =
       (_func_int **)&PTR__CompleteBestLiteralSelector_00b68640;
  (this->_comp).super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp).super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68690;
  (this->_comp)._c1.super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp)._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68330;
  (this->_comp)._c2.super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp)._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b686d0;
  (this->_comp)._c2._c1.super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp)._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68500;
  (this->_comp)._c2._c2.super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp)._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68710;
  (this->_comp)._c2._c2._c1.super_LiteralComparator._selector = (LiteralSelector *)0x0;
  (this->_comp)._c2._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68580;
  (this->_comp)._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b53a08;
  (this->_comp)._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68750;
  (this->_comp)._c2._c2._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68790;
  (this->_comp)._c2._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68370;
  (this->_comp)._c2._c2._c2._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b683b0;
  (this->_comp)._c2._c2._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b683f0;
  (this->_comp).super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c1.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c1.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c2.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c2._c1.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c2._c2.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c2._c2._c1.super_LiteralComparator._selector = &this->super_LiteralSelector;
  (this->_comp)._c2._c2._c2._c2.super_LiteralComparator._selector = &this->super_LiteralSelector;
  *(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
    **)((long)&(this->_comp)._c2._c2._c2._c2._c1.super_LiteralComparator + 8) = this;
  *(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
    **)((long)&(this->_comp)._c2._c2._c2._c2._c2.super_LiteralComparator + 8) = this;
  return;
}

Assistant:

LiteralSelector(const Ordering& ordering, const Options& options)
  : _ord(ordering), _opt(options), _reversePolarity(false)
  {
  }